

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneratedSaxParserParserTemplate.h
# Opt level: O0

void __thiscall
GeneratedSaxParser::
ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
::parseNamespaceDeclarations
          (ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
           *this,ParserAttributes *attributes)

{
  ParserChar *text;
  bool bVar1;
  StringHash SVar2;
  long *in_RSI;
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_unsigned_long>_>,_bool> pVar3;
  StringHashPair SVar4;
  StringHash name;
  StringHash prefix;
  ParserChar *attributeValue;
  StringHashPair hashPair;
  ParserChar *attribute;
  const_iterator it;
  NamespaceStackFrame *topElement;
  NamespaceStackFrame stackFrame;
  ParserChar **attributeArray;
  value_type *in_stack_fffffffffffffee8;
  NamespaceStackFrame *in_stack_fffffffffffffef0;
  value_type *in_stack_fffffffffffffef8;
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *in_stack_ffffffffffffff00;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_unsigned_long>_> in_stack_ffffffffffffff28;
  _Self local_68;
  _Self local_60;
  reference local_58;
  long *local_18;
  
  local_18 = (long *)*in_RSI;
  if (local_18 != (long *)0x0) {
    NamespaceStackFrame::NamespaceStackFrame(in_stack_fffffffffffffef0);
    bVar1 = std::
            stack<GeneratedSaxParser::NamespaceStackFrame,_std::deque<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>_>
            ::empty((stack<GeneratedSaxParser::NamespaceStackFrame,_std::deque<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>_>
                     *)0xa91ba4);
    if (!bVar1) {
      local_58 = std::
                 stack<GeneratedSaxParser::NamespaceStackFrame,_std::deque<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>_>
                 ::top((stack<GeneratedSaxParser::NamespaceStackFrame,_std::deque<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>_>
                        *)0xa91bbd);
      local_60._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
           ::begin(&in_stack_fffffffffffffee8->namespaces);
      while( true ) {
        local_68._M_node =
             (_Base_ptr)
             std::
             map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
             ::end(&in_stack_fffffffffffffee8->namespaces);
        bVar1 = std::operator!=(&local_60,&local_68);
        if (!bVar1) break;
        std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::operator*
                  ((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_> *)
                   0xa91c17);
        pVar3 = std::
                map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                ::insert(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
        in_stack_ffffffffffffff28 = pVar3.first._M_node;
        std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::operator++
                  ((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_> *)
                   in_stack_fffffffffffffef0);
      }
    }
    while (*local_18 != 0) {
      SVar4 = Utils::calculateStringHashWithNamespace((ParserChar *)in_stack_ffffffffffffff00);
      if (local_18 + 1 == (long *)0x0) {
        local_18 = (long *)0x0;
        goto LAB_00a91e13;
      }
      text = (ParserChar *)local_18[1];
      local_18 = local_18 + 2;
      if ((SVar4.first == 0) && (SVar4.second == 0x7f4353)) {
        SVar2 = Utils::calculateStringHash(text);
        in_stack_ffffffffffffff00 =
             (map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
              *)std::
                map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                ::operator[](in_RDI,(key_type *)in_stack_ffffffffffffff28._M_node);
        *(StringHash *)&(in_stack_ffffffffffffff00->_M_t)._M_impl = SVar2;
      }
      else if (SVar4.first == 0x7f4353) {
        SVar2 = Utils::calculateStringHash(text);
        in_stack_fffffffffffffef0 =
             (NamespaceStackFrame *)
             std::
             map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
             ::operator[](in_RDI,(key_type *)in_stack_ffffffffffffff28._M_node);
        *(StringHash *)&(in_stack_fffffffffffffef0->namespaces)._M_t._M_impl = SVar2;
      }
    }
    bVar1 = std::
            map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
            ::empty((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                     *)0xa91dea);
    if (!bVar1) {
      std::
      stack<GeneratedSaxParser::NamespaceStackFrame,_std::deque<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>_>
      ::push((stack<GeneratedSaxParser::NamespaceStackFrame,_std::deque<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>_>
              *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    }
LAB_00a91e13:
    NamespaceStackFrame::~NamespaceStackFrame((NamespaceStackFrame *)0xa91e20);
  }
  return;
}

Assistant:

void ParserTemplate<DerivedClass, ImplClass>::parseNamespaceDeclarations( const ParserAttributes& attributes )
    {
        const ParserChar** attributeArray = attributes.attributes;
        if ( attributeArray )
        {
            NamespaceStackFrame stackFrame;
            if ( !mNamespacesStack.empty() )
            {
                const NamespaceStackFrame& topElement = mNamespacesStack.top();
                typename NamespacePrefixesMap::const_iterator it = topElement.namespaces.begin();
                for (; it != topElement.namespaces.end(); ++it)
                {
                    stackFrame.namespaces.insert(*it);
                }
            }
            while (true)
            {
                const ParserChar * attribute = *attributeArray;
                if ( !attribute )
                    break;
                StringHashPair hashPair = GeneratedSaxParser::Utils::calculateStringHashWithNamespace(attribute);
                attributeArray++;
                if ( !attributeArray )
                    return;
                const ParserChar* attributeValue = *attributeArray;
                attributeArray++;

                StringHash prefix = hashPair.first;
                StringHash name = hashPair.second;
                if ( prefix == 0 && name == XML_ATTRIBUTE_XMLNS_HASH )
                {
                    // set default namespace
                    stackFrame.namespaces[ 0 ] = GeneratedSaxParser::Utils::calculateStringHash( attributeValue );
                }
                else if ( prefix == XML_ATTRIBUTE_XMLNS_HASH )
                {
                    // set namespace with prefix
                    stackFrame.namespaces[ name ] = GeneratedSaxParser::Utils::calculateStringHash( attributeValue );
                }
            }
            if ( !stackFrame.namespaces.empty() )
            {
                mNamespacesStack.push( stackFrame );
            }
        }
    }